

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16663::ChecksumOnlyFileSystem_basic_Test::TestBody
          (ChecksumOnlyFileSystem_basic_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer pFVar3;
  pointer this_00;
  int __fd;
  char *in_R9;
  string local_570;
  AssertHelper local_550;
  Message local_548;
  bool local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar__3;
  Twine local_518;
  undefined1 local_500 [8];
  error_code ec;
  Message local_4e8;
  StringRef local_4e0;
  string local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_3;
  string local_490;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_470;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> ourFileContents;
  Message local_460;
  void *local_458;
  pointer local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_2;
  string local_430 [32];
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> local_410;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> missingFileContents;
  Message local_400;
  unsigned_long_long local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_1;
  Message local_3d8;
  unsigned_long_long local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_398;
  Message local_390;
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__2;
  string local_360;
  undefined1 local_340 [8];
  FileInfo ourFileInfo;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__1;
  string local_2a0 [32];
  undefined1 local_280 [8];
  FileInfo missingFileInfo;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1d8 [8];
  raw_fd_ostream os;
  error_code ec_1;
  StringRef local_168;
  Twine local_158;
  undefined1 local_140 [8];
  SmallString<256U> tempPath;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  ChecksumOnlyFileSystem_basic_Test *this_local;
  
  fs._M_t.
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl =
       (__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
        )(__uniq_ptr_data<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>,_true,_true>
          )this;
  llbuild::basic::createLocalFileSystem();
  llbuild::basic::ChecksumOnlyFileSystem::from
            ((ChecksumOnlyFileSystem *)&stack0xffffffffffffffd8,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)(tempPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                 InlineElts + 0xf8));
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               *)(tempPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                  InlineElts + 0xf8));
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_140);
  llvm::Twine::Twine(&local_158,"FileSystemTests");
  strlen("txt");
  llvm::sys::fs::createTemporaryFile(&local_158,local_168,(SmallVectorImpl<char> *)local_140);
  std::error_code::error_code((error_code *)&os.SupportsSeeking);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_140);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_1d8,join_0x00000010_0x00000000_,
             (error_code *)&os.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
  local_1f9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(missingFileInfo.checksum.bytes + 0x18),(internal *)local_1f8,
               (AssertionResult *)0x27eef0,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)(missingFileInfo.checksum.bytes + 0x18));
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  __fd = 0x27e85a;
  llvm::raw_ostream::operator<<((raw_ostream *)local_1d8,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)local_1d8,__fd);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_1d8);
  pFVar3 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)&stack0xffffffffffffffd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2a0,"/does/not/exists",
             (allocator *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  (*pFVar3->_vptr_FileSystem[7])(local_280,pFVar3,local_2a0);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  local_2b9 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_280);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(ourFileInfo.checksum.bytes + 0x18),(internal *)local_2b8,
               (AssertionResult *)"missingFileInfo.isMissing()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)(ourFileInfo.checksum.bytes + 0x18));
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  pFVar3 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)&stack0xffffffffffffffd8);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_140);
  llvm::StringRef::operator_cast_to_string(&local_360,(StringRef *)&gtest_ar__2.message_);
  (*pFVar3->_vptr_FileSystem[7])(local_340,pFVar3,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_340);
  local_381 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_380,&local_381,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_380,
               (AssertionResult *)"ourFileInfo.isMissing()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  local_3d0 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long_long,_nullptr>
            ((EqHelper *)local_3c8,"ourFileInfo.device","0ull",(unsigned_long *)local_340,&local_3d0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  local_3f8 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long_long,_nullptr>
            ((EqHelper *)local_3f0,"ourFileInfo.inode","0ull",&ourFileInfo.device,&local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&missingFileContents,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&missingFileContents,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&missingFileContents);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  pFVar3 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)&stack0xffffffffffffffd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_430,"/does/not/exist",
             (allocator *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  (*pFVar3->_vptr_FileSystem[4])(&local_410,pFVar3,local_430);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  local_450 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::get
                        (&local_410);
  local_458 = (void *)0x0;
  testing::internal::EqHelper::Compare<llvm::MemoryBuffer_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_448,"missingFileContents.get()","nullptr",&local_450,&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ourFileContents,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ourFileContents,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ourFileContents);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  pFVar3 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)&stack0xffffffffffffffd8);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_140);
  llvm::StringRef::operator_cast_to_string(&local_490,(StringRef *)&gtest_ar_3.message_);
  (*pFVar3->_vptr_FileSystem[4])(&local_470,pFVar3,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  this_00 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
            operator->(&local_470);
  local_4e0 = llvm::MemoryBuffer::getBuffer(this_00);
  llvm::StringRef::str_abi_cxx11_(&local_4d0,&local_4e0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[14],_nullptr>
            ((EqHelper *)local_4b0,"ourFileContents->getBuffer().str()","\"Hello, world!\"",
             &local_4d0,(char (*) [14])"Hello, world!");
  std::__cxx11::string::~string((string *)&local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ec._M_cat,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ec._M_cat,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ec._M_cat);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_140);
  llvm::Twine::Twine(&local_518,(StringRef *)&gtest_ar__3.message_);
  local_500._0_4_ = llvm::sys::fs::remove((fs *)&local_518,(char *)0x1);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_500);
  local_539 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_538,&local_539,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_548);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_570,(internal *)local_538,(AssertionResult *)0x27eef0,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    std::__cxx11::string::~string((string *)&local_570);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_470);
  std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::~unique_ptr
            (&local_410);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_140);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

TEST(ChecksumOnlyFileSystem, basic) {
  // Check basic sanity of the local filesystem object.
  auto fs = ChecksumOnlyFileSystem::from(createLocalFileSystem());

  // Write a temp file.
  SmallString<256> tempPath;
  llvm::sys::fs::createTemporaryFile("FileSystemTests", "txt", tempPath);
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(tempPath.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto missingFileInfo = fs->getFileInfo("/does/not/exists");
  EXPECT_TRUE(missingFileInfo.isMissing());

  auto ourFileInfo = fs->getFileInfo(tempPath.str());
  EXPECT_FALSE(ourFileInfo.isMissing());

  EXPECT_EQ(ourFileInfo.device, 0ull);
  EXPECT_EQ(ourFileInfo.inode, 0ull);

  auto missingFileContents = fs->getFileContents("/does/not/exist");
  EXPECT_EQ(missingFileContents.get(), nullptr);

  auto ourFileContents = fs->getFileContents(tempPath.str());
  EXPECT_EQ(ourFileContents->getBuffer().str(), "Hello, world!");
  // Remove the temporary file.
  auto ec = llvm::sys::fs::remove(tempPath.str());
  EXPECT_FALSE(ec);
}